

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void write_section(char *section_name)

{
  section *psVar1;
  char cVar2;
  FILE *pFVar3;
  file_info *__ptr;
  int iVar4;
  int __c;
  undefined8 extraout_RAX;
  uint uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  section *psVar6;
  FILE *__stream;
  char **ppcVar7;
  bool bVar8;
  
  psVar6 = section_list;
  bVar8 = section_list[0].name == (char *)0x0;
  if (!bVar8) {
    iVar4 = strcmp(section_list[0].name,section_name);
    if (iVar4 != 0) {
      psVar6 = section_list;
      do {
        psVar1 = psVar6 + 1;
        bVar8 = psVar1->name == (char *)0x0;
        if (bVar8) goto LAB_0011099c;
        psVar6 = psVar6 + 1;
        iVar4 = strcmp(psVar1->name,section_name);
      } while (iVar4 != 0);
    }
    pFVar3 = code_file;
    if (!bVar8) {
      if (psVar6->ptr[lflag != '\0'] != (char *)0x0) {
        ppcVar7 = psVar6->ptr + (lflag != '\0');
        do {
          ppcVar7 = ppcVar7 + 1;
          outline = outline + 1;
          fprintf((FILE *)pFVar3,"%s\n");
        } while (*ppcVar7 != (char *)0x0);
      }
      return;
    }
  }
LAB_0011099c:
  write_section_cold_1();
  pFVar3 = code_file;
  if (line == (char *)0x0) {
    return;
  }
  __stream = (FILE *)input_file->file;
  if (lflag == '\0') {
    outline = outline + 1;
    fprintf((FILE *)code_file,line_format,(ulong)(uint)input_file->lineno,input_file->name,in_R8,
            in_R9,extraout_RAX,section_name);
  }
  while( true ) {
    cVar2 = *cptr;
    if (cVar2 == '\n') break;
    cptr = cptr + 1;
    putc((int)cVar2,(FILE *)pFVar3);
  }
  outline = outline + 1;
  cptr = cptr + 1;
  putc(10,(FILE *)pFVar3);
LAB_00110a41:
  iVar4 = 10;
  do {
    __c = getc(__stream);
    __ptr = input_file;
    if (__c == 10) {
      outline = outline + 1;
    }
    else if (__c == -1) break;
    putc(__c,(FILE *)pFVar3);
    iVar4 = __c;
  } while( true );
  if (input_file->next == (file_info *)0x0) {
    if (iVar4 != 10) {
      outline = outline + 1;
      putc(10,(FILE *)pFVar3);
    }
    if (lflag != '\0') {
      return;
    }
    uVar5 = outline + 2;
    outline = outline + 1;
    fprintf((FILE *)pFVar3,line_format,(ulong)uVar5,code_file_name);
    return;
  }
  fclose((FILE *)input_file->file);
  free(input_file->name);
  input_file = input_file->next;
  free(__ptr);
  __stream = (FILE *)input_file->file;
  if (iVar4 != 10) {
    outline = outline + 1;
    putc(10,(FILE *)pFVar3);
  }
  if (lflag == '\0') {
    outline = outline + 1;
    fprintf((FILE *)pFVar3,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  goto LAB_00110a41;
}

Assistant:

void write_section(char *section_name)
{
    char **section;
    FILE *fp;
    int i;
    struct section *sl;

    for(sl=&section_list[0]; sl->name; sl++) {
      if(strcmp(sl->name,section_name)==0) {
	break;
      }
    }
    if(sl->name==0) {
      fprintf(stderr, "Cannot find section '%s' in your skeleton file\n", section_name);
      exit(1);
    }

    section =  sl->ptr;
    fp = code_file;
    for (i = lflag ? 1 : 0; section[i]; ++i)
    {
	++outline;
	fprintf(fp, "%s\n", section[i]);
    }
}